

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

spv_result_t spvtools::val::CapabilityPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  bool bVar2;
  Op OVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar4;
  spv_parsed_operand_t *psVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  spv_const_context psVar6;
  char *__s;
  DiagnosticStream *pDVar7;
  bool local_c51;
  string local_c48;
  DiagnosticStream local_c28;
  string local_a50;
  DiagnosticStream local_a30;
  string local_858;
  DiagnosticStream local_838;
  string local_660;
  DiagnosticStream local_640;
  string local_468;
  DiagnosticStream local_448;
  undefined4 local_26c;
  string local_268;
  DiagnosticStream local_248;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string opencl_profile;
  bool opencl_embedded;
  ValidationState_t *pVStack_40;
  spv_target_env env;
  anon_class_16_2_ec1f0190 capability_str;
  uint32_t capability;
  spv_parsed_operand_t *operand;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar3 = Instruction::opcode(inst);
  if (OVar3 != OpCapability) {
    return SPV_SUCCESS;
  }
  this = Instruction::operands(inst);
  sVar4 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
  if (sVar4 != 1) {
    __assert_fail("inst->operands().size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x124,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  psVar5 = Instruction::operand(inst,0);
  if (psVar5->num_words != 1) {
    __assert_fail("operand.num_words == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x128,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  uVar1 = psVar5->offset;
  this_00 = Instruction::words(inst);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  if (sVar4 <= uVar1) {
    __assert_fail("operand.offset < inst->words().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x129,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  capability_str._._0_4_ = Instruction::word(inst,(ulong)psVar5->offset);
  pVStack_40 = _;
  capability_str._12_4_ = (uint32_t)capability_str._;
  psVar6 = ValidationState_t::context(_);
  opencl_profile.field_2._12_4_ = psVar6->target_env;
  local_c51 = true;
  if (((opencl_profile.field_2._12_4_ != SPV_ENV_OPENCL_EMBEDDED_1_2) &&
      (local_c51 = true, opencl_profile.field_2._12_4_ != SPV_ENV_OPENCL_EMBEDDED_2_0)) &&
     (local_c51 = true, opencl_profile.field_2._12_4_ != SPV_ENV_OPENCL_EMBEDDED_2_1)) {
    local_c51 = opencl_profile.field_2._12_4_ == SPV_ENV_OPENCL_EMBEDDED_2_2;
  }
  opencl_profile.field_2._M_local_buf[0xb] = local_c51;
  __s = "Full";
  if (local_c51 != false) {
    __s = "Embedded";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_69);
  std::allocator<char>::~allocator(&local_69);
  if (opencl_profile.field_2._12_4_ == 1) {
    bVar2 = anon_unknown_3::IsSupportGuaranteedVulkan_1_0(capability_str._12_4_);
    if (((!bVar2) &&
        (bVar2 = anon_unknown_3::IsSupportOptionalVulkan_1_0(capability_str._12_4_), !bVar2)) &&
       (bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2)) {
      ValidationState_t::diag(&local_248,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      pDVar7 = DiagnosticStream::operator<<(&local_248,(char (*) [12])"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_268,&stack0xffffffffffffffc0);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_268);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [44])" is not allowed by Vulkan 1.0 specification");
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [25])" (or requires extension)");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_268);
      DiagnosticStream::~DiagnosticStream(&local_248);
      goto LAB_0025fbe9;
    }
  }
  else if (opencl_profile.field_2._12_4_ == 0x12) {
    bVar2 = anon_unknown_3::IsSupportGuaranteedVulkan_1_1(capability_str._12_4_);
    if (((!bVar2) &&
        (bVar2 = anon_unknown_3::IsSupportOptionalVulkan_1_1(capability_str._12_4_), !bVar2)) &&
       (bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2)) {
      ValidationState_t::diag(&local_448,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      pDVar7 = DiagnosticStream::operator<<(&local_448,(char (*) [12])"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_468,&stack0xffffffffffffffc0);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_468);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [44])" is not allowed by Vulkan 1.1 specification");
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [25])" (or requires extension)");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_468);
      DiagnosticStream::~DiagnosticStream(&local_448);
      goto LAB_0025fbe9;
    }
  }
  else if (opencl_profile.field_2._12_4_ == 0x17) {
    bVar2 = anon_unknown_3::IsSupportGuaranteedVulkan_1_2(capability_str._12_4_);
    if (((!bVar2) &&
        (bVar2 = anon_unknown_3::IsSupportOptionalVulkan_1_2(capability_str._12_4_), !bVar2)) &&
       (bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2)) {
      ValidationState_t::diag(&local_640,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      pDVar7 = DiagnosticStream::operator<<(&local_640,(char (*) [12])"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_660,&stack0xffffffffffffffc0);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_660);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [44])" is not allowed by Vulkan 1.2 specification");
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [25])" (or requires extension)");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_660);
      DiagnosticStream::~DiagnosticStream(&local_640);
      goto LAB_0025fbe9;
    }
  }
  else if ((opencl_profile.field_2._12_4_ == 0xb) || (opencl_profile.field_2._12_4_ == 0xc)) {
    bVar2 = anon_unknown_3::IsSupportGuaranteedOpenCL_1_2
                      (capability_str._12_4_,(bool)(opencl_profile.field_2._M_local_buf[0xb] & 1));
    if (((!bVar2) &&
        ((bVar2 = anon_unknown_3::IsSupportOptionalOpenCL_1_2(capability_str._12_4_), !bVar2 &&
         (bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2)))) &&
       (bVar2 = anon_unknown_3::IsEnabledByCapabilityOpenCL_1_2(_,capability_str._12_4_), !bVar2)) {
      ValidationState_t::diag(&local_838,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      pDVar7 = DiagnosticStream::operator<<(&local_838,(char (*) [12])"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_858,&stack0xffffffffffffffc0);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_858);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [31])" is not allowed by OpenCL 1.2 ");
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [23])" Profile specification");
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [39])" (or requires extension or capability)");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_858);
      DiagnosticStream::~DiagnosticStream(&local_838);
      goto LAB_0025fbe9;
    }
  }
  else if ((((opencl_profile.field_2._12_4_ == 0xd) || (opencl_profile.field_2._12_4_ == 0xe)) ||
           (opencl_profile.field_2._12_4_ == 3)) || (opencl_profile.field_2._12_4_ == 0xf)) {
    bVar2 = anon_unknown_3::IsSupportGuaranteedOpenCL_2_0
                      (capability_str._12_4_,(bool)(opencl_profile.field_2._M_local_buf[0xb] & 1));
    if (((!bVar2) &&
        (bVar2 = anon_unknown_3::IsSupportOptionalOpenCL_1_2(capability_str._12_4_), !bVar2)) &&
       ((bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2 &&
        (bVar2 = anon_unknown_3::IsEnabledByCapabilityOpenCL_2_0(_,capability_str._12_4_), !bVar2)))
       ) {
      ValidationState_t::diag(&local_a30,_,SPV_ERROR_INVALID_CAPABILITY,inst);
      pDVar7 = DiagnosticStream::operator<<(&local_a30,(char (*) [12])"Capability ");
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_a50,&stack0xffffffffffffffc0);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_a50);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [35])" is not allowed by OpenCL 2.0/2.1 ");
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [23])" Profile specification");
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [39])" (or requires extension or capability)");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_a50);
      DiagnosticStream::~DiagnosticStream(&local_a30);
      goto LAB_0025fbe9;
    }
  }
  else if (((opencl_profile.field_2._12_4_ == 4) || (opencl_profile.field_2._12_4_ == 0x10)) &&
          ((bVar2 = anon_unknown_3::IsSupportGuaranteedOpenCL_2_2
                              (capability_str._12_4_,
                               (bool)(opencl_profile.field_2._M_local_buf[0xb] & 1)), !bVar2 &&
           (((bVar2 = anon_unknown_3::IsSupportOptionalOpenCL_1_2(capability_str._12_4_), !bVar2 &&
             (bVar2 = anon_unknown_3::IsEnabledByExtension(_,capability_str._12_4_), !bVar2)) &&
            (bVar2 = anon_unknown_3::IsEnabledByCapabilityOpenCL_2_0(_,capability_str._12_4_),
            !bVar2)))))) {
    ValidationState_t::diag(&local_c28,_,SPV_ERROR_INVALID_CAPABILITY,inst);
    pDVar7 = DiagnosticStream::operator<<(&local_c28,(char (*) [12])"Capability ");
    CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
    operator()[abi_cxx11_(&local_c48,&stack0xffffffffffffffc0);
    pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_c48);
    pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [31])" is not allowed by OpenCL 2.2 ");
    pDVar7 = DiagnosticStream::operator<<
                       (pDVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68);
    pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [23])" Profile specification");
    pDVar7 = DiagnosticStream::operator<<
                       (pDVar7,(char (*) [39])" (or requires extension or capability)");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
    std::__cxx11::string::~string((string *)&local_c48);
    DiagnosticStream::~DiagnosticStream(&local_c28);
    goto LAB_0025fbe9;
  }
  __local._4_4_ = SPV_SUCCESS;
LAB_0025fbe9:
  local_26c = 1;
  std::__cxx11::string::~string((string *)local_68);
  return __local._4_4_;
}

Assistant:

spv_result_t CapabilityPass(ValidationState_t& _, const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpCapability) return SPV_SUCCESS;

  assert(inst->operands().size() == 1);

  const spv_parsed_operand_t& operand = inst->operand(0);

  assert(operand.num_words == 1);
  assert(operand.offset < inst->words().size());

  const uint32_t capability = inst->word(operand.offset);
  const auto capability_str = [&_, capability]() {
    spv_operand_desc desc = nullptr;
    if (_.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                                  &desc) != SPV_SUCCESS ||
        !desc) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  };

  const auto env = _.context()->target_env;
  const bool opencl_embedded = env == SPV_ENV_OPENCL_EMBEDDED_1_2 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_1 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_2;
  const std::string opencl_profile = opencl_embedded ? "Embedded" : "Full";
  if (env == SPV_ENV_VULKAN_1_0) {
    if (!IsSupportGuaranteedVulkan_1_0(capability) &&
        !IsSupportOptionalVulkan_1_0(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.0 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_1) {
    if (!IsSupportGuaranteedVulkan_1_1(capability) &&
        !IsSupportOptionalVulkan_1_1(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.1 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_2) {
    if (!IsSupportGuaranteedVulkan_1_2(capability) &&
        !IsSupportOptionalVulkan_1_2(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.2 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_OPENCL_1_2 || env == SPV_ENV_OPENCL_EMBEDDED_1_2) {
    if (!IsSupportGuaranteedOpenCL_1_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_1_2(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 1.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_0 || env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
             env == SPV_ENV_OPENCL_2_1 || env == SPV_ENV_OPENCL_EMBEDDED_2_1) {
    if (!IsSupportGuaranteedOpenCL_2_0(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.0/2.1 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_2 || env == SPV_ENV_OPENCL_EMBEDDED_2_2) {
    if (!IsSupportGuaranteedOpenCL_2_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  }

  return SPV_SUCCESS;
}